

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O2

void jpc_qmfb_split_colgrp(jpc_fix_t *a,uint numrows,uint stride,uint parity)

{
  jpc_fix_t *ptr;
  jpc_fix_t *pjVar1;
  int iVar2;
  jpc_fix_t *pjVar3;
  undefined1 *puVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  jpc_fix_t splitbuf [65536];
  
  ptr = splitbuf;
  uVar7 = numrows + 1;
  if (uVar7 < 0x2002) {
    if (numrows < 2) {
      return;
    }
  }
  else {
    ptr = (jpc_fix_t *)jas_alloc3((ulong)(uVar7 >> 1),0x10,8);
    if (ptr == (jpc_fix_t *)0x0) {
      abort();
    }
  }
  uVar7 = uVar7 - parity >> 1;
  iVar2 = numrows - uVar7;
  pjVar1 = a + (1 - parity) * stride;
  pjVar3 = pjVar1;
  puVar4 = (undefined1 *)ptr;
  iVar5 = iVar2;
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    for (lVar6 = 0; (int)lVar6 != 0x10; lVar6 = lVar6 + 1) {
      *(jpc_fix_t *)((long)puVar4 + lVar6 * 8) = pjVar3[lVar6];
    }
    puVar4 = (undefined1 *)((long)puVar4 + 0x80);
    pjVar3 = pjVar3 + stride * 2;
  }
  pjVar3 = a + (2 - parity) * stride;
  iVar5 = uVar7 - (parity == 0);
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    for (lVar6 = 0; (int)lVar6 != 0x10; lVar6 = lVar6 + 1) {
      pjVar1[lVar6] = pjVar3[lVar6];
    }
    pjVar3 = pjVar3 + stride * 2;
    pjVar1 = pjVar1 + stride;
  }
  pjVar1 = a + uVar7 * stride;
  puVar4 = (undefined1 *)ptr;
  while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
    for (lVar6 = 0; (int)lVar6 != 0x10; lVar6 = lVar6 + 1) {
      pjVar1[lVar6] = *(jpc_fix_t *)((long)puVar4 + lVar6 * 8);
    }
    puVar4 = (undefined1 *)((long)puVar4 + 0x80);
    pjVar1 = pjVar1 + stride;
  }
  if (ptr != splitbuf) {
    jas_free(ptr);
  }
  return;
}

Assistant:

static void jpc_qmfb_split_colgrp(jpc_fix_t *a, unsigned numrows, unsigned stride,
  unsigned parity)
{

	jpc_fix_t splitbuf[QMFB_SPLITBUFSIZE * JPC_QMFB_COLGRPSIZE];
	jpc_fix_t *buf = splitbuf;
	jpc_fix_t *srcptr;
	jpc_fix_t *dstptr;
	register jpc_fix_t *srcptr2;
	register jpc_fix_t *dstptr2;

	/* Get a buffer. */
	const size_t bufsize = JPC_CEILDIVPOW2(numrows, 1);
	if (bufsize > QMFB_SPLITBUFSIZE) {
		if (!(buf = jas_alloc3(bufsize, JPC_QMFB_COLGRPSIZE,
		  sizeof(jpc_fix_t)))) {
			/* We have no choice but to commit suicide in this case. */
			abort();
		}
	}

	if (numrows >= 2) {
		const unsigned hstartrow = (numrows + 1 - parity) >> 1;
		// ORIGINAL (WRONG): m = (parity) ? hstartrow : (numrows - hstartrow);
		const unsigned m = numrows - hstartrow;

		/* Save the samples destined for the highpass channel. */
		dstptr = buf;
		srcptr = &a[(1 - parity) * stride];
		for (unsigned n = m; n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += JPC_QMFB_COLGRPSIZE;
			srcptr += stride << 1;
		}
		/* Copy the appropriate samples into the lowpass channel. */
		dstptr = &a[(1 - parity) * stride];
		srcptr = &a[(2 - parity) * stride];
		for (unsigned n = numrows - m - (!parity); n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += stride;
			srcptr += stride << 1;
		}
		/* Copy the saved samples into the highpass channel. */
		dstptr = &a[hstartrow * stride];
		srcptr = buf;
		for (unsigned n = m; n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += stride;
			srcptr += JPC_QMFB_COLGRPSIZE;
		}
	}

	/* If the split buffer was allocated on the heap, free this memory. */
	if (buf != splitbuf) {
		jas_free(buf);
	}

}